

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O2

float GD::finalize_prediction(shared_data *sd,float ret)

{
  ostream *poVar1;
  float fVar2;
  
  if ((~(uint)ret & 0x7fc00000) == 0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"NAN prediction in example ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,", forcing ");
    poVar1 = std::ostream::_M_insert<double>(0.0);
    std::endl<char,std::char_traits<char>>(poVar1);
    fVar2 = 0.0;
  }
  else {
    fVar2 = sd->max_label;
    if ((ret <= sd->max_label) && (fVar2 = sd->min_label, sd->min_label <= ret)) {
      fVar2 = ret;
    }
  }
  return fVar2;
}

Assistant:

float finalize_prediction(shared_data* sd, float ret)
{
  if (nanpattern(ret))
  {
    ret = 0.;
    cerr << "NAN prediction in example " << sd->example_number + 1 << ", forcing " << ret << endl;
    return ret;
  }
  if (ret > sd->max_label)
    return (float)sd->max_label;
  if (ret < sd->min_label)
    return (float)sd->min_label;
  return ret;
}